

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall OpenMPOrderedDirective::OpenMPOrderedDirective(OpenMPOrderedDirective *this)

{
  OpenMPDirective::OpenMPDirective(&this->super_OpenMPDirective,OMPD_ordered,Lang_unknown,0,0);
  return;
}

Assistant:

OpenMPOrderedDirective() : OpenMPDirective(OMPD_ordered) { }